

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_trips_db(feed_db_t *db,trip_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_298 [8];
  char qr [152];
  sqlite3_stmt *stmt;
  int i;
  int record_count;
  feed_db_status_t res;
  trip_t record;
  trip_t **records_local;
  feed_db_t *db_local;
  
  record._452_8_ = records;
  db_local._4_4_ = count_rows_db(db,"trips");
  stmt._0_4_ = 0;
  if (0 < db_local._4_4_) {
    memcpy(local_298,
           "SELECT route_id, service_id, trip_id,trip_headsign, trip_short_name,direction_id, block_id, shape_id,wheelchair_accessible, bikes_allowed FROM `trips`;"
           ,0x98);
    sqlite3_prepare_v2(db->conn,local_298,-1,(sqlite3_stmt **)(qr + 0x90),(char **)0x0);
    pvVar2 = malloc((long)db_local._4_4_ * 0x1cc);
    *(void **)record._452_8_ = pvVar2;
    if (*(long *)record._452_8_ == 0) {
      sqlite3_finalize((sqlite3_stmt *)qr._144_8_);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step((sqlite3_stmt *)qr._144_8_);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_trip((trip_t *)&record_count);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._144_8_,0);
        strcpy((char *)&record_count,(char *)puVar3);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._144_8_,1);
        strcpy(record.route_id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._144_8_,2);
        strcpy(record.service_id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._144_8_,3);
        strcpy(record.id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._144_8_,4);
        strcpy(record.headsign + 0x38,(char *)puVar3);
        record.short_name._56_4_ = sqlite3_column_int((sqlite3_stmt *)qr._144_8_,5);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._144_8_,6);
        strcpy(record.short_name + 0x3c,(char *)puVar3);
        puVar3 = sqlite3_column_text((sqlite3_stmt *)qr._144_8_,7);
        strcpy(record.block_id + 0x38,(char *)puVar3);
        record.shape_id._56_4_ = sqlite3_column_int((sqlite3_stmt *)qr._144_8_,8);
        record.shape_id._60_4_ = sqlite3_column_int((sqlite3_stmt *)qr._144_8_,9);
        memcpy((void *)(*(long *)record._452_8_ + (long)(int)stmt * 0x1cc),&record_count,0x1cc);
        stmt._0_4_ = (int)stmt + 1;
      } while ((int)stmt < db_local._4_4_);
      sqlite3_finalize((sqlite3_stmt *)qr._144_8_);
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_trips_db(feed_db_t *db, trip_t **records) {

    trip_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "trips");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "route_id, service_id, trip_id,"
                    "trip_headsign, trip_short_name,"
                    "direction_id, block_id, shape_id,"
                    "wheelchair_accessible, bikes_allowed "
                "FROM `trips`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_trip(&record);

        strcpy(record.route_id, sqlite3_column_text(stmt, 0));
        strcpy(record.service_id, sqlite3_column_text(stmt, 1));
        strcpy(record.id, sqlite3_column_text(stmt, 2));
        strcpy(record.headsign, sqlite3_column_text(stmt, 3));
        strcpy(record.short_name, sqlite3_column_text(stmt, 4));
        record.direction_id = sqlite3_column_int(stmt, 5);
        strcpy(record.block_id, sqlite3_column_text(stmt, 6));
        strcpy(record.shape_id, sqlite3_column_text(stmt, 7));
        record.wheelchair_accessible = (wheelchair_accessible_t)sqlite3_column_int(stmt, 8);
        record.bikes_allowed = (bikes_allowed_t)sqlite3_column_int(stmt, 9);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}